

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O3

Shr_Man_t * Shr_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  char *pcVar2;
  Shr_Man_t *pSVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *pcVar9;
  Bdc_Man_t *pBVar10;
  Rsb_Man_t *pRVar11;
  int nObjsMax;
  int iVar12;
  
  pSVar3 = (Shr_Man_t *)calloc(1,0x80);
  pSVar3->nDivMax = 0x40;
  iVar1 = pGia->nObjs;
  nObjsMax = iVar1 * 2;
  pSVar3->nNewSize = nObjsMax;
  pSVar3->pGia = pGia;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  pwVar5 = (word *)malloc(8000);
  pVVar4->pArray = pwVar5;
  pSVar3->vFanMem = pVVar4;
  Vec_WrdPush(pVVar4,0xffffffffffffffff);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < nObjsMax - 1U) {
    iVar12 = nObjsMax;
  }
  pVVar6->nCap = iVar12;
  if (iVar12 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = nObjsMax;
  }
  else {
    piVar7 = (int *)malloc((long)iVar12 * 4);
    pVVar6->pArray = piVar7;
    pVVar6->nSize = nObjsMax;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,(long)iVar1 << 3);
    }
  }
  pSVar3->vObj2Fan = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  pSVar3->vDivs = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  pSVar3->vPrio = pVVar6;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = iVar12;
  if (iVar12 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar12 << 3);
  }
  pVVar4->pArray = pwVar5;
  pVVar4->nSize = nObjsMax;
  pcVar9 = (char *)0x0;
  memset(pwVar5,0,(long)nObjsMax << 3);
  pSVar3->vTruths = pVVar4;
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  pwVar5 = (word *)malloc(800);
  pVVar4->pArray = pwVar5;
  pSVar3->vDivTruths = pVVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  pSVar3->vDivResub = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  pSVar3->vLeaves = pVVar6;
  p = Gia_ManStart(nObjsMax);
  pSVar3->pNew = p;
  pcVar2 = pGia->pName;
  if (pcVar2 != (char *)0x0) {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p->pName = pcVar9;
  pcVar2 = pGia->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p->pSpec = pcVar9;
  Gia_ManHashAlloc(p);
  Gia_ManCleanLevels(p,nObjsMax);
  p->nObjs = nObjsMax;
  Gia_ManIncrementTravId(p);
  p->nObjs = 1;
  (pSVar3->Pars).nVarsMax = 6;
  (pSVar3->Pars).fVerbose = 0;
  pBVar10 = Bdc_ManAlloc(&pSVar3->Pars);
  pSVar3->pManDec = pBVar10;
  pRVar11 = Rsb_ManAlloc(6,pSVar3->nDivMax,4,1);
  pSVar3->pManRsb = pRVar11;
  return pSVar3;
}

Assistant:

Shr_Man_t * Shr_ManAlloc( Gia_Man_t * pGia )
{
    Shr_Man_t * p;
    p = ABC_CALLOC( Shr_Man_t, 1 );
    p->nDivMax     = 64;
    p->nNewSize    = 2 * Gia_ManObjNum(pGia);
    p->pGia        = pGia;
    p->vFanMem     = Vec_WrdAlloc( 1000 );   Vec_WrdPush(p->vFanMem, -1); 
    p->vObj2Fan    = Vec_IntStart( p->nNewSize );
    p->vDivs       = Vec_IntAlloc( 1000 );
    p->vPrio       = Vec_IntAlloc( 1000 );
    p->vTruths     = Vec_WrdStart( p->nNewSize );
    p->vDivTruths  = Vec_WrdAlloc( 100 );
    p->vDivResub   = Vec_IntAlloc( 6 );
    p->vLeaves     = Vec_IntAlloc( 6 );
    // start new manager
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start decompostion
    p->Pars.nVarsMax = 6;
    p->Pars.fVerbose = 0;
    p->pManDec = Bdc_ManAlloc( &p->Pars );
    p->pManRsb = Rsb_ManAlloc( 6, p->nDivMax, 4, 1 );
    return p;
}